

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastUnknownEnumFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  ushort *puVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  uint *puVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  
  bVar1 = *ptr;
  pVar9.second._0_1_ = bVar1;
  pVar9.first = ptr + 1;
  pVar9._9_7_ = 0;
  pcVar6 = ptr;
  if ((char)bVar1 < '\0') {
    bVar2 = ptr[1];
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
    uVar5 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
    if ((char)bVar2 < '\0') {
      pcVar6 = (char *)(ulong)uVar5;
      pVar9 = ReadTagFallback(ptr,uVar5);
    }
    else {
      pcVar6 = ptr + 2;
      pVar9.second = uVar5;
      pVar9.first = pcVar6;
      pVar9._12_4_ = 0;
    }
  }
  pcVar3 = pVar9.first;
  if (pcVar3 == (char *)0x0) goto LAB_00281a95;
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*pcVar3;
  if ((long)data.field_0 < 0) {
    pcVar6 = (char *)((long)pcVar3[1] << 7 | 0x7f);
    if ((long)pcVar6 < 0) {
      uVar7 = (long)pcVar3[2] << 0xe | 0x3fff;
      if ((long)uVar7 < 0) {
        pcVar6 = (char *)((ulong)pcVar6 & ((long)pcVar3[3] << 0x15 | 0x1fffffU));
        if ((long)pcVar6 < 0) {
          uVar7 = uVar7 & ((long)pcVar3[4] << 0x1c | 0xfffffffU);
          if ((long)uVar7 < 0) {
            pcVar6 = (char *)((ulong)pcVar6 & ((long)pcVar3[5] << 0x23 | 0x7ffffffffU));
            if ((long)pcVar6 < 0) {
              uVar7 = uVar7 & ((long)pcVar3[6] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar7 < 0) {
                pcVar6 = (char *)((ulong)pcVar6 & ((long)pcVar3[7] << 0x31 | 0x1ffffffffffffU));
                if ((long)pcVar6 < 0) {
                  uVar7 = uVar7 & ((ulong)(byte)pcVar3[8] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar7 < 0) {
                    puVar4 = (ushort *)(pcVar3 + 10);
                    if (pcVar3[9] != '\x01') {
                      if (pcVar3[9] < '\0') {
                        puVar4 = (ushort *)0x0;
                        goto LAB_00281a22;
                      }
                      if ((pcVar3[9] & 1U) == 0) {
                        uVar7 = uVar7 ^ 0x8000000000000000;
                      }
                    }
                  }
                  else {
                    puVar4 = (ushort *)(pcVar3 + 9);
                  }
                }
                else {
                  puVar4 = (ushort *)(pcVar3 + 8);
                }
              }
              else {
                puVar4 = (ushort *)(pcVar3 + 7);
              }
            }
            else {
              puVar4 = (ushort *)(pcVar3 + 6);
            }
          }
          else {
            puVar4 = (ushort *)(pcVar3 + 5);
          }
        }
        else {
          puVar4 = (ushort *)(pcVar3 + 4);
        }
      }
      else {
        puVar4 = (ushort *)(pcVar3 + 3);
      }
      pcVar6 = (char *)((ulong)pcVar6 & uVar7);
    }
    else {
      puVar4 = (ushort *)(pcVar3 + 2);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)data.field_0 & (ulong)pcVar6);
  }
  else {
    puVar4 = (ushort *)(pcVar3 + 1);
  }
LAB_00281a22:
  if (puVar4 != (ushort *)0x0) {
    AddUnknownEnum(msg,table,pVar9.second,SUB84(data.field_0.data,0));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar4) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar8 & 3) != 0) {
          AlignFail(puVar8);
        }
        *puVar8 = *puVar8 | (uint)hasbits;
      }
      return (char *)puVar4;
    }
    uVar5 = (uint)table->fast_idx_mask & (uint)*puVar4;
    if ((uVar5 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar7 = (ulong)(uVar5 & 0xfffffff8);
    pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                               (msg,puVar4,ctx,
                                (ulong)*puVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),
                                table,hasbits);
    return pcVar6;
  }
LAB_00281a95:
  pcVar6 = Error(msg,pcVar6,pVar9._8_8_,data,table,hasbits);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUnknownEnumFallback(
    PROTOBUF_TC_PARAM_DECL) {
  // Skip MiniParse/fallback and insert the element directly into the unknown
  // field set. We also normalize the value into an int32 as we do for known
  // enum values.
  uint32_t tag;
  ptr = ReadTag(ptr, &tag);
  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  AddUnknownEnum(msg, table, tag, static_cast<int32_t>(tmp));
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}